

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

void __thiscall DebugLogHelper::check_found(DebugLogHelper *this)

{
  bool bVar1;
  runtime_error *this_00;
  Logger *in_RDI;
  long in_FS_OFFSET;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
  *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  iterator it;
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  it._M_node = (_List_node_base *)in_RDI;
  noui_reconnect();
  LogInstance();
  BCLog::Logger::DeleteCallback(in_RDI,it);
  if ((((in_RDI->m_cs).super_mutex.super___mutex_base._M_mutex.__size[0x20] & 1U) == 0) &&
     (bVar1 = std::
              function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
              ::operator()(in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8), bVar1)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    tinyformat::format<std::__cxx11::string>((char *)it._M_node,in_stack_ffffffffffffffc0);
    std::runtime_error::runtime_error(this_00,local_28);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DebugLogHelper::check_found()
{
    noui_reconnect();
    LogInstance().DeleteCallback(m_print_connection);
    if (!m_found && m_match(nullptr)) {
        throw std::runtime_error(strprintf("'%s' not found in debug log\n", m_message));
    }
}